

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

aiMesh * Assimp::MakeSubmesh(aiMesh *pMesh,
                            vector<unsigned_int,_std::allocator<unsigned_int>_> *subMeshFaces,
                            uint subFlags)

{
  uint uVar1;
  aiVector3D *paVar2;
  long lVar3;
  aiColor4D *paVar4;
  aiBone *paVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  pointer puVar28;
  bool bVar29;
  uint uVar30;
  aiMesh *this;
  size_type sVar31;
  const_reference pvVar32;
  aiFace *paVar33;
  reference pvVar34;
  size_type sVar35;
  ulong uVar36;
  aiVector3t<float> *paVar37;
  aiColor4t<float> *paVar38;
  size_type *psVar39;
  uint *puVar40;
  void *pvVar41;
  undefined8 *puVar42;
  aiBone *this_00;
  aiVertexWeight *paVar43;
  ulong uVar44;
  aiVertexWeight *local_308;
  aiFace *local_298;
  aiColor4t<float> *local_268;
  aiVector3t<float> *local_238;
  aiVector3t<float> *local_208;
  aiVector3t<float> *local_1e0;
  aiVector3t<float> *local_1b0;
  aiVector3t<float> *local_180;
  aiVertexWeight local_140;
  aiVertexWeight w;
  uint v_1;
  uint b_2;
  aiBone *bone_1;
  aiBone *newBone;
  uint a_5;
  uint nbParanoia;
  uint a_4;
  uint v;
  uint b_1;
  aiBone *bone;
  allocator<unsigned_int> local_f5;
  uint a_3;
  undefined1 local_f0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> subBones;
  size_t cc_1;
  size_t c_1;
  size_t cc;
  size_t c;
  uint nvi;
  uint srcIndex;
  size_t b;
  aiFace *dstFace;
  aiFace *srcFace;
  uint uStack_90;
  uint a_2;
  size_t a_1;
  size_t a;
  uint j;
  aiFace *f;
  uint i;
  size_t numSubFaces;
  size_t numSubVerts;
  allocator<unsigned_int> local_45;
  value_type_conflict4 local_44;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vMap;
  aiMesh *oMesh;
  uint subFlags_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *subMeshFaces_local;
  aiMesh *pMesh_local;
  
  this = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this);
  uVar1 = pMesh->mNumVertices;
  local_44 = 0xffffffff;
  vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_int>::allocator(&local_45);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,(ulong)uVar1,&local_44,
             &local_45);
  std::allocator<unsigned_int>::~allocator(&local_45);
  numSubFaces = 0;
  sVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(subMeshFaces);
  for (f._4_4_ = 0; f._4_4_ < sVar31; f._4_4_ = f._4_4_ + 1) {
    paVar33 = pMesh->mFaces;
    pvVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (subMeshFaces,(ulong)f._4_4_);
    paVar33 = paVar33 + *pvVar32;
    for (a._4_4_ = 0; a._4_4_ < paVar33->mNumIndices; a._4_4_ = a._4_4_ + 1) {
      pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                           (ulong)paVar33->mIndices[a._4_4_]);
      if (*pvVar34 == 0xffffffff) {
        pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                             (ulong)paVar33->mIndices[a._4_4_]);
        *pvVar34 = (value_type)numSubFaces;
        numSubFaces = numSubFaces + 1;
      }
    }
  }
  aiString::operator=((aiString *)
                      (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x3b),&pMesh->mName);
  vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[0x3a] = pMesh->mMaterialIndex;
  *vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = pMesh->mPrimitiveTypes;
  sVar35 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(subMeshFaces);
  vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[2] = (uint)sVar35;
  vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1] = (uint)numSubFaces;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = numSubFaces;
  uVar36 = SUB168(auVar6 * ZEXT816(0xc),0);
  if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
    uVar36 = 0xffffffffffffffff;
  }
  paVar37 = (aiVector3t<float> *)operator_new__(uVar36);
  if (numSubFaces != 0) {
    local_180 = paVar37;
    do {
      aiVector3t<float>::aiVector3t(local_180);
      local_180 = local_180 + 1;
    } while (local_180 != paVar37 + numSubFaces);
  }
  *(aiVector3t<float> **)
   (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage + 4) = paVar37;
  bVar29 = aiMesh::HasNormals(pMesh);
  if (bVar29) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = numSubFaces;
    uVar36 = SUB168(auVar7 * ZEXT816(0xc),0);
    if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
      uVar36 = 0xffffffffffffffff;
    }
    paVar37 = (aiVector3t<float> *)operator_new__(uVar36);
    if (numSubFaces != 0) {
      local_1b0 = paVar37;
      do {
        aiVector3t<float>::aiVector3t(local_1b0);
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 != paVar37 + numSubFaces);
    }
    *(aiVector3t<float> **)
     (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + 6) = paVar37;
  }
  bVar29 = aiMesh::HasTangentsAndBitangents(pMesh);
  if (bVar29) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = numSubFaces;
    uVar36 = SUB168(auVar8 * ZEXT816(0xc),0);
    if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
      uVar36 = 0xffffffffffffffff;
    }
    paVar37 = (aiVector3t<float> *)operator_new__(uVar36);
    if (numSubFaces != 0) {
      local_1e0 = paVar37;
      do {
        aiVector3t<float>::aiVector3t(local_1e0);
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != paVar37 + numSubFaces);
    }
    *(aiVector3t<float> **)
     (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + 8) = paVar37;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = numSubFaces;
    uVar36 = SUB168(auVar9 * ZEXT816(0xc),0);
    if (SUB168(auVar9 * ZEXT816(0xc),8) != 0) {
      uVar36 = 0xffffffffffffffff;
    }
    paVar37 = (aiVector3t<float> *)operator_new__(uVar36);
    if (numSubFaces != 0) {
      local_208 = paVar37;
      do {
        aiVector3t<float>::aiVector3t(local_208);
        local_208 = local_208 + 1;
      } while (local_208 != paVar37 + numSubFaces);
    }
    *(aiVector3t<float> **)
     (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + 10) = paVar37;
  }
  a_1 = 0;
  while( true ) {
    bVar29 = aiMesh::HasTextureCoords(pMesh,(uint)a_1);
    if (!bVar29) break;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = numSubFaces;
    uVar36 = SUB168(auVar10 * ZEXT816(0xc),0);
    if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
      uVar36 = 0xffffffffffffffff;
    }
    paVar37 = (aiVector3t<float> *)operator_new__(uVar36);
    if (numSubFaces != 0) {
      local_238 = paVar37;
      do {
        aiVector3t<float>::aiVector3t(local_238);
        local_238 = local_238 + 1;
      } while (local_238 != paVar37 + numSubFaces);
    }
    *(aiVector3t<float> **)
     (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + a_1 * 2 + 0x1c) = paVar37;
    vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[a_1 + 0x2c] = pMesh->mNumUVComponents[a_1];
    a_1 = a_1 + 1;
  }
  _uStack_90 = 0;
  while( true ) {
    bVar29 = aiMesh::HasVertexColors(pMesh,uStack_90);
    if (!bVar29) break;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = numSubFaces;
    uVar36 = SUB168(auVar11 * ZEXT816(0x10),0);
    if (SUB168(auVar11 * ZEXT816(0x10),8) != 0) {
      uVar36 = 0xffffffffffffffff;
    }
    paVar38 = (aiColor4t<float> *)operator_new__(uVar36);
    if (numSubFaces != 0) {
      local_268 = paVar38;
      do {
        aiColor4t<float>::aiColor4t(local_268);
        local_268 = local_268 + 1;
      } while (local_268 != paVar38 + numSubFaces);
    }
    *(aiColor4t<float> **)
     (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + _uStack_90 * 2 + 0xc) = paVar38;
    _uStack_90 = _uStack_90 + 1;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = sVar31;
  uVar36 = SUB168(auVar12 * ZEXT816(0x10),0);
  uVar44 = uVar36 + 8;
  if (0xfffffffffffffff7 < uVar36) {
    uVar44 = 0xffffffffffffffff;
  }
  if (SUB168(auVar12 * ZEXT816(0x10),8) != 0) {
    uVar44 = 0xffffffffffffffff;
  }
  psVar39 = (size_type *)operator_new__(uVar44);
  *psVar39 = sVar31;
  paVar33 = (aiFace *)(psVar39 + 1);
  if (sVar31 != 0) {
    local_298 = paVar33;
    do {
      aiFace::aiFace(local_298);
      local_298 = local_298 + 1;
    } while (local_298 != paVar33 + sVar31);
  }
  *(aiFace **)
   (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage + 0x34) = paVar33;
  for (srcFace._4_4_ = 0; srcFace._4_4_ < sVar31; srcFace._4_4_ = srcFace._4_4_ + 1) {
    paVar33 = pMesh->mFaces;
    pvVar32 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (subMeshFaces,(ulong)srcFace._4_4_);
    uVar1 = *pvVar32;
    puVar40 = (uint *)(*(long *)(vMap.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 0x34) +
                      (ulong)srcFace._4_4_ * 0x10);
    *puVar40 = paVar33[uVar1].mNumIndices;
    pvVar41 = operator_new__((ulong)*puVar40 << 2);
    *(void **)(puVar40 + 2) = pvVar41;
    for (_nvi = 0; _nvi < *puVar40; _nvi = _nvi + 1) {
      pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                           (ulong)paVar33[uVar1].mIndices[_nvi]);
      *(value_type *)(*(long *)(puVar40 + 2) + _nvi * 4) = *pvVar34;
    }
  }
  for (c._4_4_ = 0; c._4_4_ < pMesh->mNumVertices; c._4_4_ = c._4_4_ + 1) {
    pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                         (ulong)c._4_4_);
    uVar1 = *pvVar34;
    if (uVar1 != 0xffffffff) {
      paVar2 = pMesh->mVertices;
      lVar3 = *(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage + 4);
      *(float *)(lVar3 + 8 + (ulong)uVar1 * 0xc) = paVar2[c._4_4_].z;
      *(undefined8 *)(lVar3 + (ulong)uVar1 * 0xc) = *(undefined8 *)(paVar2 + c._4_4_);
      bVar29 = aiMesh::HasNormals(pMesh);
      if (bVar29) {
        paVar2 = pMesh->mNormals;
        puVar42 = (undefined8 *)
                  (*(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 6) +
                  (ulong)uVar1 * 0xc);
        *puVar42 = *(undefined8 *)(paVar2 + c._4_4_);
        *(float *)(puVar42 + 1) = paVar2[c._4_4_].z;
      }
      bVar29 = aiMesh::HasTangentsAndBitangents(pMesh);
      if (bVar29) {
        paVar2 = pMesh->mTangents;
        puVar42 = (undefined8 *)
                  (*(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 8) +
                  (ulong)uVar1 * 0xc);
        *puVar42 = *(undefined8 *)(paVar2 + c._4_4_);
        *(float *)(puVar42 + 1) = paVar2[c._4_4_].z;
        paVar2 = pMesh->mBitangents;
        puVar42 = (undefined8 *)
                  (*(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 10) +
                  (ulong)uVar1 * 0xc);
        *puVar42 = *(undefined8 *)(paVar2 + c._4_4_);
        *(float *)(puVar42 + 1) = paVar2[c._4_4_].z;
      }
      cc = 0;
      uVar30 = aiMesh::GetNumUVChannels(pMesh);
      for (; cc < uVar30; cc = cc + 1) {
        paVar2 = pMesh->mTextureCoords[cc];
        puVar42 = (undefined8 *)
                  (*(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + cc * 2 + 0x1c) +
                  (ulong)uVar1 * 0xc);
        *puVar42 = *(undefined8 *)(paVar2 + c._4_4_);
        *(float *)(puVar42 + 1) = paVar2[c._4_4_].z;
      }
      cc_1 = 0;
      uVar30 = aiMesh::GetNumColorChannels(pMesh);
      subBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar30;
      for (; cc_1 < subBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage; cc_1 = cc_1 + 1) {
        paVar4 = pMesh->mColors[cc_1];
        puVar42 = (undefined8 *)
                  (*(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + cc_1 * 2 + 0xc) +
                  (ulong)uVar1 * 0x10);
        *puVar42 = *(undefined8 *)(paVar4 + c._4_4_);
        puVar42[1] = *(undefined8 *)&paVar4[c._4_4_].b;
      }
    }
  }
  if (((subFlags ^ 0xffffffff) & 1) != 0) {
    uVar1 = pMesh->mNumBones;
    a_3 = 0;
    std::allocator<unsigned_int>::allocator(&local_f5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0,(ulong)uVar1,&a_3,
               &local_f5);
    std::allocator<unsigned_int>::~allocator(&local_f5);
    for (bone._4_4_ = 0; bone._4_4_ < pMesh->mNumBones; bone._4_4_ = bone._4_4_ + 1) {
      paVar5 = pMesh->mBones[bone._4_4_];
      for (a_4 = 0; a_4 < paVar5->mNumWeights; a_4 = a_4 + 1) {
        pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                             (ulong)paVar5->mWeights[a_4].mVertexId);
        if (*pvVar34 != 0xffffffff) {
          pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0,
                               (ulong)bone._4_4_);
          *pvVar34 = *pvVar34 + 1;
        }
      }
    }
    for (a_5 = 0; a_5 < pMesh->mNumBones; a_5 = a_5 + 1) {
      pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0,
                           (ulong)a_5);
      if (*pvVar34 != 0) {
        vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x36] =
             vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[0x36] + 1;
      }
    }
    if (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x36] != 0) {
      uVar1 = vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[0x36];
      pvVar41 = operator_new__((ulong)uVar1 << 3);
      memset(pvVar41,0,(ulong)uVar1 << 3);
      *(void **)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x38) = pvVar41;
      uVar1 = vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[0x36];
      vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x36] = 0;
      for (newBone._4_4_ = 0; newBone._4_4_ < pMesh->mNumBones; newBone._4_4_ = newBone._4_4_ + 1) {
        pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0,
                             (ulong)newBone._4_4_);
        if (*pvVar34 != 0) {
          this_00 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(this_00);
          uVar30 = vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[0x36];
          vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[0x36] = uVar30 + 1;
          *(aiBone **)
           (*(long *)(vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x38) + (ulong)uVar30 * 8) =
               this_00;
          paVar5 = pMesh->mBones[newBone._4_4_];
          aiString::operator=((aiString *)this_00,&paVar5->mName);
          fVar24 = (paVar5->mOffsetMatrix).a1;
          fVar25 = (paVar5->mOffsetMatrix).a2;
          fVar26 = (paVar5->mOffsetMatrix).a3;
          fVar27 = (paVar5->mOffsetMatrix).a4;
          fVar20 = (paVar5->mOffsetMatrix).b1;
          fVar21 = (paVar5->mOffsetMatrix).b2;
          fVar22 = (paVar5->mOffsetMatrix).b3;
          fVar23 = (paVar5->mOffsetMatrix).b4;
          fVar16 = (paVar5->mOffsetMatrix).c1;
          fVar17 = (paVar5->mOffsetMatrix).c2;
          fVar18 = (paVar5->mOffsetMatrix).c3;
          fVar19 = (paVar5->mOffsetMatrix).c4;
          fVar13 = (paVar5->mOffsetMatrix).d2;
          fVar14 = (paVar5->mOffsetMatrix).d3;
          fVar15 = (paVar5->mOffsetMatrix).d4;
          (this_00->mOffsetMatrix).d1 = (paVar5->mOffsetMatrix).d1;
          (this_00->mOffsetMatrix).d2 = fVar13;
          (this_00->mOffsetMatrix).d3 = fVar14;
          (this_00->mOffsetMatrix).d4 = fVar15;
          (this_00->mOffsetMatrix).c1 = fVar16;
          (this_00->mOffsetMatrix).c2 = fVar17;
          (this_00->mOffsetMatrix).c3 = fVar18;
          (this_00->mOffsetMatrix).c4 = fVar19;
          (this_00->mOffsetMatrix).b1 = fVar20;
          (this_00->mOffsetMatrix).b2 = fVar21;
          (this_00->mOffsetMatrix).b3 = fVar22;
          (this_00->mOffsetMatrix).b4 = fVar23;
          (this_00->mOffsetMatrix).a1 = fVar24;
          (this_00->mOffsetMatrix).a2 = fVar25;
          (this_00->mOffsetMatrix).a3 = fVar26;
          (this_00->mOffsetMatrix).a4 = fVar27;
          pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0,
                               (ulong)newBone._4_4_);
          uVar36 = (ulong)*pvVar34;
          paVar43 = (aiVertexWeight *)operator_new__(uVar36 << 3);
          if (uVar36 != 0) {
            local_308 = paVar43;
            do {
              aiVertexWeight::aiVertexWeight(local_308);
              local_308 = local_308 + 1;
            } while (local_308 != paVar43 + uVar36);
          }
          this_00->mWeights = paVar43;
          for (w.mWeight = 0.0; (uint)w.mWeight < paVar5->mNumWeights;
              w.mWeight = (float)((int)w.mWeight + 1)) {
            pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                                 (ulong)paVar5->mWeights[(uint)w.mWeight].mVertexId);
            w.mVertexId = *pvVar34;
            if (w.mVertexId != 0xffffffff) {
              aiVertexWeight::aiVertexWeight
                        (&local_140,w.mVertexId,paVar5->mWeights[(uint)w.mWeight].mWeight);
              uVar30 = this_00->mNumWeights;
              this_00->mNumWeights = uVar30 + 1;
              this_00->mWeights[uVar30] = local_140;
            }
          }
        }
      }
      if (uVar1 != vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[0x36]) {
        __assert_fail("nbParanoia==oMesh->mNumBones",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                      ,0x1b3,
                      "aiMesh *Assimp::MakeSubmesh(const aiMesh *, const std::vector<unsigned int> &, unsigned int)"
                     );
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f0);
  }
  puVar28 = vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return (aiMesh *)puVar28;
}

Assistant:

aiMesh* MakeSubmesh(const aiMesh *pMesh, const std::vector<unsigned int> &subMeshFaces, unsigned int subFlags)
{
    aiMesh *oMesh = new aiMesh();
    std::vector<unsigned int> vMap(pMesh->mNumVertices,UINT_MAX);

    size_t numSubVerts = 0;
    size_t numSubFaces = subMeshFaces.size();

    for(unsigned int i=0;i<numSubFaces;i++) {
        const aiFace &f = pMesh->mFaces[subMeshFaces[i]];

        for(unsigned int j=0;j<f.mNumIndices;j++)   {
            if(vMap[f.mIndices[j]]==UINT_MAX)   {
                vMap[f.mIndices[j]] = static_cast<unsigned int>(numSubVerts++);
            }
        }
    }

    oMesh->mName = pMesh->mName;

    oMesh->mMaterialIndex = pMesh->mMaterialIndex;
    oMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;

    // create all the arrays for this mesh if the old mesh contained them

    oMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
    oMesh->mNumVertices = static_cast<unsigned int>(numSubVerts);
    oMesh->mVertices = new aiVector3D[numSubVerts];
    if( pMesh->HasNormals() ) {
        oMesh->mNormals = new aiVector3D[numSubVerts];
    }

    if( pMesh->HasTangentsAndBitangents() ) {
        oMesh->mTangents = new aiVector3D[numSubVerts];
        oMesh->mBitangents = new aiVector3D[numSubVerts];
    }

    for( size_t a = 0;  pMesh->HasTextureCoords(static_cast<unsigned int>(a)) ; ++a ) {
        oMesh->mTextureCoords[a] = new aiVector3D[numSubVerts];
        oMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
    }

    for( size_t a = 0; pMesh->HasVertexColors( static_cast<unsigned int>(a)); ++a )    {
        oMesh->mColors[a] = new aiColor4D[numSubVerts];
    }

    // and copy over the data, generating faces with linear indices along the way
    oMesh->mFaces = new aiFace[numSubFaces];

    for(unsigned int a = 0; a < numSubFaces; ++a )  {

        const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
        aiFace& dstFace = oMesh->mFaces[a];
        dstFace.mNumIndices = srcFace.mNumIndices;
        dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

        // accumulate linearly all the vertices of the source face
        for( size_t b = 0; b < dstFace.mNumIndices; ++b )   {
            dstFace.mIndices[b] = vMap[srcFace.mIndices[b]];
        }
    }

    for(unsigned int srcIndex = 0; srcIndex < pMesh->mNumVertices; ++srcIndex ) {
        unsigned int nvi = vMap[srcIndex];
        if(nvi==UINT_MAX) {
            continue;
        }

        oMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
        if( pMesh->HasNormals() ) {
            oMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
        }

        if( pMesh->HasTangentsAndBitangents() ) {
            oMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
            oMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumUVChannels(); c < cc; ++c )    {
                oMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumColorChannels(); c < cc; ++c ) {
            oMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
        }
    }

    if(~subFlags&AI_SUBMESH_FLAGS_SANS_BONES)   {
        std::vector<unsigned int> subBones(pMesh->mNumBones,0);

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            const aiBone* bone = pMesh->mBones[a];

            for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                unsigned int v = vMap[bone->mWeights[b].mVertexId];

                if(v!=UINT_MAX) {
                    subBones[a]++;
                }
            }
        }

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            if(subBones[a]>0) {
                oMesh->mNumBones++;
            }
        }

        if(oMesh->mNumBones) {
            oMesh->mBones = new aiBone*[oMesh->mNumBones]();
            unsigned int nbParanoia = oMesh->mNumBones;

            oMesh->mNumBones = 0; //rewind

            for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
                if(subBones[a]==0) {
                    continue;
                }
                aiBone *newBone = new aiBone;
                oMesh->mBones[oMesh->mNumBones++] = newBone;

                const aiBone* bone = pMesh->mBones[a];

                newBone->mName = bone->mName;
                newBone->mOffsetMatrix = bone->mOffsetMatrix;
                newBone->mWeights = new aiVertexWeight[subBones[a]];

                for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                    const unsigned int v = vMap[bone->mWeights[b].mVertexId];

                    if(v!=UINT_MAX) {
                        aiVertexWeight w(v,bone->mWeights[b].mWeight);
                        newBone->mWeights[newBone->mNumWeights++] = w;
                    }
                }
            }

            ai_assert(nbParanoia==oMesh->mNumBones);
            (void)nbParanoia; // remove compiler warning on release build
        }
    }

    return oMesh;
}